

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::Deserializer::deserialize<std::vector<dap::integer,std::allocator<dap::integer>>>
          (Deserializer *this,
          optional<std::vector<dap::integer,_std::allocator<dap::integer>_>_> *opt)

{
  bool bVar1;
  vector<dap::integer,_std::allocator<dap::integer>_> v;
  _Vector_base<dap::integer,_std::allocator<dap::integer>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = deserialize<dap::integer>(this,(array<dap::integer> *)&local_28);
  if (bVar1) {
    optional<std::vector<dap::integer,std::allocator<dap::integer>>>::operator=
              ((optional<std::vector<dap::integer,std::allocator<dap::integer>>> *)opt,
               (vector<dap::integer,_std::allocator<dap::integer>_> *)&local_28);
  }
  std::_Vector_base<dap::integer,_std::allocator<dap::integer>_>::~_Vector_base(&local_28);
  return true;
}

Assistant:

bool Deserializer::deserialize(dap::optional<T>* opt) const {
  T v;
  if (deserialize(&v)) {
    *opt = v;
  }
  return true;
}